

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_echo_server.cpp
# Opt level: O0

void __thiscall echo_server::handle_timeout(echo_server *this,tcp_connection *conn)

{
  ostream *poVar1;
  id __id;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  endpoint local_28 [8];
  endpoint ep;
  tcp_connection *conn_local;
  echo_server *this_local;
  
  _local_28 = ranger::event::tcp_connection::remote_endpoint();
  poVar1 = std::operator<<((ostream *)&std::cerr,"thread[");
  __id = std::this_thread::get_id();
  pbVar2 = std::operator<<(poVar1,__id);
  poVar1 = std::operator<<(pbVar2,"] ");
  poVar1 = std::operator<<(poVar1,"connection[");
  poVar1 = ranger::event::operator<<(poVar1,local_28);
  poVar1 = std::operator<<(poVar1,"] ");
  poVar1 = std::operator<<(poVar1,"timeout.");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::
  set<ranger::event::tcp_connection,_std::less<ranger::event::tcp_connection>,_std::allocator<ranger::event::tcp_connection>_>
  ::erase(&this->m_conn_set,conn);
  return;
}

Assistant:

void handle_timeout(ranger::event::tcp_connection& conn) {
		auto ep = conn.remote_endpoint();
		std::cerr << "thread[" << std::this_thread::get_id() << "] " << "connection[" << ep << "] " << "timeout." << std::endl;

		m_conn_set.erase(conn);
	}